

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O1

void CompiledMixedType<signed_char,long_long>(void)

{
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  char ret;
  char ret_3;
  char ret_7;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> local_41;
  ulong local_40;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_32;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> local_31;
  
  local_32.m_int = '\0';
  local_40 = 0;
  local_41 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)0x0;
  MultiplicationHelper<signed_char,_long_long,_14>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ('\0',(longlong *)&local_40,(char *)&local_41);
  local_40 = 0;
  local_41 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)0x0;
  MultiplicationHelper<signed_char,_long_long,_14>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (local_32.m_int,(longlong *)&local_40,(char *)&local_41);
  local_40 = 0;
  MultiplicationHelper<signed_char,_long_long,_14>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (local_32.m_int,(longlong *)&local_40,&local_32.m_int);
  local_40 = 0;
  MultiplicationHelper<signed_char,_long_long,_14>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (local_32.m_int,(longlong *)&local_40,&local_32.m_int);
  local_32.m_int = '\x01';
  local_40 = 1;
  local_41 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)0x0;
  DivisionHelper<signed_char,_long_long,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_32.m_int,(longlong *)&local_40,(char *)&local_41);
  local_40 = local_40 & 0xffffffffffffff00;
  local_41 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)0x1;
  DivisionHelper<signed_char,_signed_char,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_32.m_int,(char *)&local_41,(char *)&local_40);
  operator/(1,local_32);
  local_40 = 1;
  DivisionHelper<signed_char,_long_long,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_32.m_int,(longlong *)&local_40,&local_32.m_int);
  local_40 = 1;
  DivisionHelper<signed_char,_long_long,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_32.m_int,(longlong *)&local_40,&local_32.m_int);
  local_40 = 1;
  local_41 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)0x0;
  AdditionHelper<signed_char,_long_long,_11>::
  AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_32.m_int,(longlong *)&local_40,(char *)&local_41);
  if (0xfffffeff < (int)local_32.m_int - 0x7fU) {
    local_40 = 1;
    local_41 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)0x0;
    local_31 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)
               local_32.m_int;
    AdditionHelper<signed_char,_long_long,_11>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((char *)&local_31,(longlong *)&local_40,(char *)&local_41);
    local_40 = 1;
    AdditionHelper<signed_char,_long_long,_11>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((char *)&local_32,(longlong *)&local_40,(char *)&local_32);
    local_40 = 1;
    AdditionHelper<signed_char,_long_long,_11>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((char *)&local_32,(longlong *)&local_40,(char *)&local_32);
    local_32.m_int = '\0';
    local_40 = 0;
    local_41 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)0x0;
    SubtractionHelper<signed_char,_long_long,_8>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((char *)&local_32,(longlong *)&local_40,(char *)&local_41);
    local_41 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)
               local_32.m_int;
    local_40 = 0;
    local_31 = (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>)0x0;
    SubtractionHelper<long_long,_signed_char,_17>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((longlong *)&local_40,(char *)&local_41,(char *)&local_31);
    local_40 = 0;
    SubtractionHelper<signed_char,_long_long,_8>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((char *)&local_32,(longlong *)&local_40,(char *)&local_32);
    local_32.m_int = '\x01';
    local_40 = 1;
    SubtractionHelper<signed_char,_long_long,_8>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((char *)&local_32,(longlong *)&local_40,(char *)&local_32);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,1);
    SVar1 = SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_32,
                       (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1
                      );
    operator<<(SVar1.m_int,
               (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,1);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,
               (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,1);
    SVar1 = SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_32,
                       (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1
                      );
    operator>>(SVar1.m_int,
               (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,1);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,
               (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}